

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool __thiscall picojson::default_parse_context::parse_array_start(default_parse_context *this)

{
  _Base_ptr *pp_Var1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
  *this_00;
  int iVar2;
  value *pvVar3;
  array *paVar4;
  ulong uVar5;
  
  paVar4 = (array *)operator_new(0x18);
  (paVar4->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (paVar4->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (paVar4->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = this->out_;
  iVar2 = pvVar3->type_;
  pvVar3->type_ = 4;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
             *)(pvVar3->u_).array_;
  (pvVar3->u_).array_ = paVar4;
  if (iVar2 == 5) {
    if (this_00 ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      return true;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::~_Rb_tree(this_00);
    uVar5 = 0x30;
  }
  else if (iVar2 == 4) {
    if (this_00 ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      return true;
    }
    std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)this_00);
    uVar5 = 0x18;
  }
  else {
    if (iVar2 != 3) {
      return true;
    }
    if (this_00 ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      return true;
    }
    pp_Var1 = &(this_00->_M_impl).super__Rb_tree_header._M_header._M_parent;
    if ((_Base_ptr *)*(undefined1 **)&this_00->_M_impl != pp_Var1) {
      operator_delete(*(undefined1 **)&this_00->_M_impl,(ulong)((long)&(*pp_Var1)->_M_color + 1));
    }
    uVar5 = 0x20;
  }
  operator_delete(this_00,uVar5);
  return true;
}

Assistant:

bool parse_array_start() {
    *out_ = value(array_type, false);
    return true;
  }